

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  bool bVar1;
  int local_4c;
  undefined1 local_48 [4];
  int level_1;
  int local_3c;
  Comparator CStack_38;
  int level;
  Version *base;
  MutexLock l;
  int max_level_with_files;
  Slice *end_local;
  Slice *begin_local;
  DBImpl *this_local;
  
  l.mu_._4_4_ = 1;
  MutexLock::MutexLock((MutexLock *)&base,&this->mutex_);
  CStack_38._vptr_Comparator = (_func_int **)VersionSet::current(this->versions_);
  for (local_3c = 1; local_3c < 7; local_3c = local_3c + 1) {
    bVar1 = Version::OverlapInLevel((Version *)CStack_38._vptr_Comparator,local_3c,begin,end);
    if (bVar1) {
      l.mu_._4_4_ = local_3c;
    }
  }
  MutexLock::~MutexLock((MutexLock *)&base);
  TEST_CompactMemTable((DBImpl *)local_48);
  Status::~Status((Status *)local_48);
  for (local_4c = 0; local_4c < l.mu_._4_4_; local_4c = local_4c + 1) {
    TEST_CompactRange(this,local_4c,begin,end);
  }
  return;
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}